

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

Fl_Help_Block * __thiscall
Fl_Help_View::add_block(Fl_Help_View *this,char *s,int xx,int yy,int ww,int hh,uchar border)

{
  int iVar1;
  Fl_Help_Block *pFVar2;
  
  iVar1 = this->ablocks_;
  if (iVar1 <= this->nblocks_) {
    this->ablocks_ = (int)((long)iVar1 + 0x10);
    if (iVar1 == 0) {
      pFVar2 = (Fl_Help_Block *)malloc(0xa80);
    }
    else {
      pFVar2 = (Fl_Help_Block *)realloc(this->blocks_,((long)iVar1 + 0x10) * 0xa8);
    }
    this->blocks_ = pFVar2;
  }
  pFVar2 = this->blocks_;
  iVar1 = this->nblocks_;
  memset(pFVar2 + iVar1,0,0xa8);
  pFVar2[iVar1].start = s;
  pFVar2[iVar1].end = s;
  pFVar2[iVar1].x = xx;
  pFVar2[iVar1].y = yy;
  pFVar2[iVar1].w = ww;
  pFVar2[iVar1].h = hh;
  pFVar2[iVar1].border = border;
  pFVar2[iVar1].bgcolor = this->bgcolor_;
  this->nblocks_ = this->nblocks_ + 1;
  return pFVar2 + iVar1;
}

Assistant:

Fl_Help_Block *					// O - Pointer to new block
Fl_Help_View::add_block(const char   *s,	// I - Pointer to start of block text
                	int           xx,	// I - X position of block
			int           yy,	// I - Y position of block
			int           ww,	// I - Right margin of block
			int           hh,	// I - Height of block
			unsigned char border)	// I - Draw border?
{
  Fl_Help_Block	*temp;				// New block


  // printf("add_block(s = %p, xx = %d, yy = %d, ww = %d, hh = %d, border = %d)\n",
  //        s, xx, yy, ww, hh, border);

  if (nblocks_ >= ablocks_)
  {
    ablocks_ += 16;

    if (ablocks_ == 16)
      blocks_ = (Fl_Help_Block *)malloc(sizeof(Fl_Help_Block) * ablocks_);
    else
      blocks_ = (Fl_Help_Block *)realloc(blocks_, sizeof(Fl_Help_Block) * ablocks_);
  }

  temp = blocks_ + nblocks_;
  memset(temp, 0, sizeof(Fl_Help_Block));
  temp->start   = s;
  temp->end     = s;
  temp->x       = xx;
  temp->y       = yy;
  temp->w       = ww;
  temp->h       = hh;
  temp->border  = border;
  temp->bgcolor = bgcolor_;
  nblocks_ ++;

  return (temp);
}